

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

void prepare_fpmt_workers
               (AV1_PRIMARY *ppi,AV1_COMP_DATA *first_cpi_data,AVxWorkerHook hook,
               int parallel_frame_count)

{
  AV1CdefWorkerData **cdef_worker;
  LRWorkerData *pLVar1;
  uint8_t uVar2;
  int iVar3;
  AV1_COMP *pAVar4;
  aom_internal_error_info *src;
  AV1_COMP *pAVar5;
  AV1CdefWorkerData *pAVar6;
  LRWorkerData *pLVar7;
  RestorationLineBuffers *pRVar8;
  int iVar9;
  AV1_COMP_DATA *pAVar10;
  ulong uVar11;
  int iVar12;
  AVxWorker *pAVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  int i;
  int frame_idx;
  int local_5c;
  int local_58;
  
  iVar3 = (ppi->p_mt_info).num_workers;
  local_58 = 0;
  local_5c = 0;
  if (0 < iVar3) {
    cdef_worker = &(ppi->p_mt_info).cdef_worker;
    uVar14 = 0;
    do {
      pAVar13 = (ppi->p_mt_info).workers + local_5c;
      (ppi->p_mt_info).p_workers[local_58] = pAVar13;
      pAVar4 = ppi->parallel_cpi[local_58];
      src = (pAVar4->common).error;
      iVar9 = _setjmp((__jmp_buf_tag *)src->jmp);
      if (iVar9 != 0) {
        src->setjmp = 0;
        if (0 < local_5c) {
          iVar9 = 0;
          lVar15 = 0;
          do {
            pAVar5 = ppi->parallel_cpi[lVar15];
            if ((ppi->p_mt_info).cdef_worker != (AV1CdefWorkerData *)0x0) {
              uVar2 = ((pAVar5->common).seq_params)->monochrome;
              ((pAVar5->mt_info).cdef_worker)->srcbuf =
                   (pAVar5->mt_info).restore_state_buf.cdef_srcbuf;
              uVar11 = uVar14;
              do {
                ((pAVar5->mt_info).cdef_worker)->colbuf[uVar11] =
                     (pAVar5->mt_info).restore_state_buf.cdef_colbuf[uVar11];
                if (uVar2 != '\0') break;
                bVar16 = uVar11 < 2;
                uVar11 = uVar11 + 1;
              } while (bVar16);
            }
            if (((((pAVar5->common).seq_params)->enable_restoration != '\0') &&
                ((pAVar5->common).features.all_lossless == false)) &&
               ((pAVar5->common).tiles.large_scale == 0)) {
              pRVar8 = (pAVar5->mt_info).restore_state_buf.rlbs;
              pLVar1 = (pAVar5->mt_info).lr_row_sync.lrworkerdata +
                       ((pAVar5->mt_info).num_workers + iVar9 + -1);
              pLVar1->rst_tmpbuf = (pAVar5->mt_info).restore_state_buf.rst_tmpbuf;
              pLVar1->rlbs = pRVar8;
            }
            iVar9 = iVar9 + (pAVar5->mt_info).num_workers;
            lVar15 = lVar15 + 1;
          } while (iVar9 < local_5c);
        }
        aom_internal_error_copy(&ppi->error,src);
      }
      src->setjmp = 1;
      (pAVar4->mt_info).workers = (ppi->p_mt_info).workers + local_5c;
      (pAVar4->mt_info).tile_thr_data = (ppi->p_mt_info).tile_thr_data + local_5c;
      (pAVar4->mt_info).num_workers = (iVar3 - local_5c) / ((int)hook - local_58);
      uVar11 = uVar14;
      do {
        iVar9 = (pAVar4->mt_info).num_workers;
        iVar12 = (ppi->p_mt_info).num_mod_workers[uVar11];
        if (iVar9 < iVar12) {
          iVar12 = iVar9;
        }
        (pAVar4->mt_info).num_mod_workers[uVar11] = iVar12;
        uVar11 = uVar11 + 1;
      } while (uVar11 != 0xc);
      pAVar6 = *cdef_worker;
      if (pAVar6 != (AV1CdefWorkerData *)0x0) {
        (pAVar4->mt_info).cdef_worker = pAVar6 + local_5c;
        (pAVar4->mt_info).restore_state_buf.cdef_srcbuf = pAVar6[local_5c].srcbuf;
        uVar2 = ((pAVar4->common).seq_params)->monochrome;
        uVar11 = uVar14;
        do {
          (pAVar4->mt_info).restore_state_buf.cdef_colbuf[uVar11] =
               ((pAVar4->mt_info).cdef_worker)->colbuf[uVar11];
          if (uVar2 != '\0') break;
          bVar16 = uVar11 < 2;
          uVar11 = uVar11 + 1;
        } while (bVar16);
      }
      if (((((pAVar4->common).seq_params)->enable_restoration != '\0') &&
          ((pAVar4->common).features.all_lossless == false)) &&
         ((pAVar4->common).tiles.large_scale == 0)) {
        iVar9 = local_5c + (pAVar4->mt_info).num_workers + -1;
        pLVar7 = (pAVar4->mt_info).lr_row_sync.lrworkerdata;
        pLVar1 = pLVar7 + iVar9;
        pRVar8 = (RestorationLineBuffers *)pLVar1->rlbs;
        (pAVar4->mt_info).restore_state_buf.rst_tmpbuf = pLVar1->rst_tmpbuf;
        (pAVar4->mt_info).restore_state_buf.rlbs = pRVar8;
        pRVar8 = (pAVar4->common).rlbs;
        pLVar7 = pLVar7 + iVar9;
        pLVar7->rst_tmpbuf = (pAVar4->common).rst_tmpbuf;
        pLVar7->rlbs = pRVar8;
      }
      local_5c = local_5c + (pAVar4->mt_info).num_workers;
      av1_alloc_cdef_buffers
                (&pAVar4->common,cdef_worker,&(pAVar4->mt_info).cdef_sync,
                 (ppi->p_mt_info).num_workers,0);
      pAVar13->hook = get_compressed_data_hook;
      pAVar13->data1 = pAVar4;
      pAVar10 = first_cpi_data;
      if (local_58 != 0) {
        pAVar10 = (AV1_COMP_DATA *)(ppi->parallel_cpi + (long)local_58 * 9 + -5);
      }
      pAVar13->data2 = pAVar10;
      local_58 = local_58 + 1;
      src->setjmp = 0;
    } while (local_5c < iVar3);
  }
  (ppi->p_mt_info).p_num_workers = (int)hook;
  return;
}

Assistant:

static inline void prepare_fpmt_workers(AV1_PRIMARY *ppi,
                                        AV1_COMP_DATA *first_cpi_data,
                                        AVxWorkerHook hook,
                                        int parallel_frame_count) {
  assert(parallel_frame_count <= ppi->num_fp_contexts &&
         parallel_frame_count > 1);

  PrimaryMultiThreadInfo *const p_mt_info = &ppi->p_mt_info;
  int num_workers = p_mt_info->num_workers;

  volatile int frame_idx = 0;
  volatile int i = 0;
  while (i < num_workers) {
    // Assign level 1 worker
    AVxWorker *frame_worker = p_mt_info->p_workers[frame_idx] =
        &p_mt_info->workers[i];
    AV1_COMP *cur_cpi = ppi->parallel_cpi[frame_idx];
    MultiThreadInfo *mt_info = &cur_cpi->mt_info;
    // This 'aom_internal_error_info' pointer is not derived from the local
    // pointer ('AV1_COMMON *const cm') to silence the compiler warning
    // "variable 'cm' might be clobbered by 'longjmp' or 'vfork' [-Wclobbered]".
    struct aom_internal_error_info *const error = cur_cpi->common.error;

    // The jmp_buf is valid only within the scope of the function that calls
    // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
    // before it returns.
    if (setjmp(error->jmp)) {
      error->setjmp = 0;
      restore_workers_after_fpmt(ppi, parallel_frame_count, i);
      aom_internal_error_copy(&ppi->error, error);
    }
    error->setjmp = 1;

    AV1_COMMON *const cm = &cur_cpi->common;
    // Assign start of level 2 worker pool
    mt_info->workers = &p_mt_info->workers[i];
    mt_info->tile_thr_data = &p_mt_info->tile_thr_data[i];
    // Assign number of workers for each frame in the parallel encode set.
    mt_info->num_workers = compute_num_workers_per_frame(
        num_workers - i, parallel_frame_count - frame_idx);
    for (int j = MOD_FP; j < NUM_MT_MODULES; j++) {
      mt_info->num_mod_workers[j] =
          AOMMIN(mt_info->num_workers, p_mt_info->num_mod_workers[j]);
    }
    if (p_mt_info->cdef_worker != NULL) {
      mt_info->cdef_worker = &p_mt_info->cdef_worker[i];

      // Back up the original cdef_worker pointers.
      mt_info->restore_state_buf.cdef_srcbuf = mt_info->cdef_worker->srcbuf;
      const int num_planes = av1_num_planes(cm);
      for (int plane = 0; plane < num_planes; plane++)
        mt_info->restore_state_buf.cdef_colbuf[plane] =
            mt_info->cdef_worker->colbuf[plane];
    }
#if !CONFIG_REALTIME_ONLY
    if (is_restoration_used(cm)) {
      // Back up the original LR buffers before update.
      int idx = i + mt_info->num_workers - 1;
      assert(idx < mt_info->lr_row_sync.num_workers);
      mt_info->restore_state_buf.rst_tmpbuf =
          mt_info->lr_row_sync.lrworkerdata[idx].rst_tmpbuf;
      mt_info->restore_state_buf.rlbs =
          mt_info->lr_row_sync.lrworkerdata[idx].rlbs;

      // Update LR buffers.
      mt_info->lr_row_sync.lrworkerdata[idx].rst_tmpbuf = cm->rst_tmpbuf;
      mt_info->lr_row_sync.lrworkerdata[idx].rlbs = cm->rlbs;
    }
#endif

    i += mt_info->num_workers;

    // At this stage, the thread specific CDEF buffers for the current frame's
    // 'common' and 'cdef_sync' only need to be allocated. 'cdef_worker' has
    // already been allocated across parallel frames.
    av1_alloc_cdef_buffers(cm, &p_mt_info->cdef_worker, &mt_info->cdef_sync,
                           p_mt_info->num_workers, 0);

    frame_worker->hook = hook;
    frame_worker->data1 = cur_cpi;
    frame_worker->data2 = (frame_idx == 0)
                              ? first_cpi_data
                              : &ppi->parallel_frames_data[frame_idx - 1];
    frame_idx++;
    error->setjmp = 0;
  }
  p_mt_info->p_num_workers = parallel_frame_count;
}